

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTActionEvents.cpp
# Opt level: O0

void TTD::NSLogEvents::GetPrototypeAction_Execute
               (EventLogEntry *evt,ThreadContextTTD *executeContext)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  ScriptContext *scriptContext;
  JsRTVarsArgumentAction_InternalUse<1UL> *argAction;
  TTDVar origVar;
  RecyclableObject *pRVar4;
  ScriptContext *pSVar5;
  undefined4 *puVar6;
  Var res;
  RecyclableObject *__obj;
  Var var;
  JsRTSingleVarArgumentAction *action;
  ScriptContext *ctx;
  ThreadContextTTD *executeContext_local;
  EventLogEntry *evt_local;
  
  scriptContext = ThreadContextTTD::GetActiveScriptContext(executeContext);
  if (scriptContext == (ScriptContext *)0x0) {
    TTDAbort_unrecoverable_error("This should be non-null!!!");
  }
  argAction = GetInlineEventDataAs<TTD::NSLogEvents::JsRTVarsArgumentAction_InternalUse<1ul>,(TTD::NSLogEvents::EventKind)50>
                        (evt);
  origVar = GetVarItem_0<1ul>(argAction);
  __obj = (RecyclableObject *)InflateVarInReplay(executeContext,origVar);
  if ((__obj != (RecyclableObject *)0x0) &&
     (BVar3 = Js::JavascriptOperators::IsObject(__obj), BVar3 != 0)) {
    pRVar4 = Js::VarTo<Js::RecyclableObject>(__obj);
    pSVar5 = Js::RecyclableObject::GetScriptContext(pRVar4);
    if (pSVar5 != scriptContext) {
      __obj = (RecyclableObject *)Js::CrossSite::MarshalVar(scriptContext,pRVar4,false);
    }
    pRVar4 = Js::JavascriptOperators::OP_GetPrototype(__obj,scriptContext);
    if ((pRVar4 != (RecyclableObject *)0x0) &&
       (BVar3 = Js::CrossSite::NeedMarshalVar(pRVar4,scriptContext), BVar3 != 0)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/TTActionEvents.cpp"
                         ,0x242,"(res == nullptr || !Js::CrossSite::NeedMarshalVar(res, ctx))",
                         "res == nullptr || !Js::CrossSite::NeedMarshalVar(res, ctx)");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 0;
    }
    JsRTActionHandleResultForReplay<TTD::NSLogEvents::JsRTVarsArgumentAction_InternalUse<1ul>,(TTD::NSLogEvents::EventKind)50>
              (executeContext,evt,pRVar4);
  }
  return;
}

Assistant:

void GetPrototypeAction_Execute(const EventLogEntry* evt, ThreadContextTTD* executeContext)
        {
            TTD_REPLAY_ACTIVE_CONTEXT(executeContext);
            const JsRTSingleVarArgumentAction* action = GetInlineEventDataAs<JsRTSingleVarArgumentAction, EventKind::GetPrototypeActionTag>(evt);
            Js::Var var = InflateVarInReplay(executeContext, GetVarItem_0(action));
            TTD_REPLAY_VALIDATE_INCOMING_OBJECT(var, ctx);

            Js::Var res = Js::JavascriptOperators::OP_GetPrototype(var,ctx);
            Assert(res == nullptr || !Js::CrossSite::NeedMarshalVar(res, ctx));

            JsRTActionHandleResultForReplay<JsRTSingleVarArgumentAction, EventKind::GetPrototypeActionTag>(executeContext, evt, res);
        }